

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::BrokenConnection::tryRead
          (BrokenConnection *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[7]>
            ((String *)&local_1c0,(Debug *)"\"broken\"","broken",(char (*) [7])maxBytes);
  Exception::Exception
            (&local_1a8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
             ,0x1983,(String *)&local_1c0);
  Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    return KJ_EXCEPTION(FAILED, "broken");
  }